

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

FinalStats * __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::FinalStats::operator+=(FinalStats *this,FinalStats *i_source)

{
  long lVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong local_28;
  size_t i;
  size_type count;
  FinalStats *i_source_local;
  FinalStats *this_local;
  
  sVar2 = std::
          vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
          ::size((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
                  *)i_source);
  for (local_28 = 0; local_28 < sVar2; local_28 = local_28 + 1) {
    pvVar3 = std::
             vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
             ::operator[]((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
                           *)i_source,local_28);
    lVar1 = pvVar3->m_existing;
    pvVar4 = std::
             vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
             ::operator[]((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
                           *)this,local_28);
    pvVar4->m_existing = lVar1 + pvVar4->m_existing;
    pvVar3 = std::
             vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
             ::operator[]((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
                           *)i_source,local_28);
    lVar1 = pvVar3->m_spawned;
    pvVar4 = std::
             vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
             ::operator[]((vector<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>::PutTypeCounters>_>
                           *)this,local_28);
    pvVar4->m_spawned = lVar1 + pvVar4->m_spawned;
  }
  *(int64_t *)(this + 0x18) = i_source->m_exceptions_during_puts + *(long *)(this + 0x18);
  *(int64_t *)(this + 0x20) = i_source->m_exceptions_during_consumes + *(long *)(this + 0x20);
  return (FinalStats *)this;
}

Assistant:

FinalStats & operator+=(const FinalStats & i_source)
            {
                auto const count = i_source.m_counters.size();
                for (size_t i = 0; i < count; i++)
                {
                    m_counters[i].m_existing += i_source.m_counters[i].m_existing;
                    m_counters[i].m_spawned += i_source.m_counters[i].m_spawned;
                }
                m_exceptions_during_puts += i_source.m_exceptions_during_puts;
                m_exceptions_during_consumes += i_source.m_exceptions_during_consumes;
                return *this;
            }